

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O2

uchar __thiscall MedianFilterCV_8U::getMedian(MedianFilterCV_8U *this,Mat *param_1,int y,int x)

{
  uchar *threeAdjacentPixels;
  uchar *threeAdjacentPixels_00;
  uchar *threeAdjacentPixels_01;
  uchar uVar1;
  MedianFilterCV_8U *this_00;
  uchar mergeResult [6];
  
  threeAdjacentPixels = this->firstTempArray;
  this_00 = this;
  initThreeAdjacentPixels(this,this->sourceImage,threeAdjacentPixels,y + -1,x,true);
  threeAdjacentPixels_00 = this->secondTempArray;
  initThreeAdjacentPixels(this_00,this->sourceImage,threeAdjacentPixels_00,y,x,true);
  threeAdjacentPixels_01 = this->thirdTempArray;
  initThreeAdjacentPixels(this_00,this->sourceImage,threeAdjacentPixels_01,y + 1,x,true);
  sortThreeElements(this,threeAdjacentPixels);
  sortThreeElements(this,threeAdjacentPixels_00);
  sortThreeElements(this,threeAdjacentPixels_01);
  mergeTwoSortedArray(this,threeAdjacentPixels,3,threeAdjacentPixels_00,3,mergeResult);
  uVar1 = getMedianOfTwoSortedArray(this,mergeResult,6,threeAdjacentPixels_01,3);
  return uVar1;
}

Assistant:

uchar MedianFilterCV_8U::getMedian(const cv::Mat &, int y, int x) {
    initThreeAdjacentPixels(*sourceImage, firstTempArray, y - 1, x, true);
    initThreeAdjacentPixels(*sourceImage, secondTempArray, y, x, true);
    initThreeAdjacentPixels(*sourceImage, thirdTempArray, y + 1, x, true);

    sortThreeElements(firstTempArray);
    sortThreeElements(secondTempArray);
    sortThreeElements(thirdTempArray);

    uchar mergeResult[6];
    mergeTwoSortedArray(firstTempArray, 3, secondTempArray, 3, mergeResult);

    return getMedianOfTwoSortedArray(mergeResult, 6, thirdTempArray, 3);
}